

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O0

int spvtools::utils::AssumedBitWidth(NumberType *type)

{
  NumberType *type_local;
  
  if (type->kind - SPV_NUMBER_UNSIGNED_INT < 3) {
    type_local._4_4_ = type->bitwidth;
  }
  else {
    type_local._4_4_ = 0;
  }
  return type_local._4_4_;
}

Assistant:

inline int AssumedBitWidth(const NumberType& type) {
  switch (type.kind) {
    case SPV_NUMBER_SIGNED_INT:
    case SPV_NUMBER_UNSIGNED_INT:
    case SPV_NUMBER_FLOATING:
      return type.bitwidth;
    default:
      break;
  }
  // We don't care about this case.
  return 0;
}